

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_surf.cc
# Opt level: O2

void __thiscall
hwtest::pgraph::anon_unknown_8::MthdSurfSwzFormat::~MthdSurfSwzFormat(MthdSurfSwzFormat *this)

{
  pgraph::SingleMthdTest::~SingleMthdTest(&this->super_SingleMthdTest);
  operator_delete(this);
  return;
}

Assistant:

bool is_valid_val() override {
		int fmt = extr(val, 0, 16);
		if (fmt == 0 || fmt > (cls & 0xff00 ? 0xe : 0xd))
			return false;
		int swzx = extr(val, 16, 8);
		int swzy = extr(val, 24, 8);
		if (swzx > 0xb)
			return false;
		if (swzy > 0xb)
			return false;
		if (swzx == 0)
			return false;
		if (swzy == 0 && cls == 0x52)
			return false;
		return true;
	}